

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Data<4U> * read_standard_pair_data<4u>(char *PATH,int interval,int *cnt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int iVar7;
  void *__addr;
  Data<4U> *pDVar8;
  ulong uVar9;
  size_t sVar10;
  ulong __size;
  char *__s;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  stat buf;
  stat local_c0;
  undefined1 auVar14 [16];
  
  iVar7 = open(PATH,0);
  fstat(iVar7,&local_c0);
  *cnt = (int)(local_c0.st_size / (long)interval);
  sVar10 = local_c0.st_size;
  __addr = mmap((void *)0x0,local_c0.st_size,1,2,iVar7,0);
  close(iVar7);
  if (__addr == (void *)0xffffffffffffffff) {
    __s = "[ERROR] MMAP FAILED!";
  }
  else {
    iVar7 = *cnt;
    __size = (ulong)(uint)(iVar7 * 8);
    pDVar8 = (Data<4U> *)malloc(__size);
    if (pDVar8 != (Data<4U> *)0x0) {
      if (0 < iVar7) {
        uVar9 = (ulong)(iVar7 + 7U & 0xfffffff8);
        auVar18 = vpbroadcastq_avx512vl();
        auVar19 = vpbroadcastq_avx512vl();
        auVar5 = vpmovsxbq_avx2(ZEXT416(0x7060504));
        auVar6 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar20._8_8_ = 1;
        auVar20._0_8_ = 1;
        auVar20._16_8_ = 1;
        auVar20._24_8_ = 1;
        auVar21._8_8_ = 8;
        auVar21._0_8_ = 8;
        auVar21._16_8_ = 8;
        auVar21._24_8_ = 8;
        do {
          uVar12 = vpcmpuq_avx512vl(auVar6,auVar18,2);
          uVar12 = uVar12 & 0xf;
          uVar11 = vpcmpuq_avx512vl(auVar5,auVar18,2);
          uVar11 = uVar11 & 0xf;
          vpmullq_avx512vl(auVar6,auVar19);
          vpmullq_avx512vl(auVar5,auVar19);
          auVar13 = vpgatherqd_avx512vl(*(undefined8 *)((long)__addr + __size));
          auVar14._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar13._4_4_;
          auVar14._0_4_ = (uint)((byte)uVar11 & 1) * auVar13._0_4_;
          auVar14._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar13._8_4_;
          auVar14._12_4_ = (uint)(byte)(uVar11 >> 3) * auVar13._12_4_;
          auVar13 = vpgatherqd_avx512vl(*(undefined8 *)((long)__addr + sVar10));
          auVar15._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar13._4_4_;
          auVar15._0_4_ = (uint)((byte)uVar12 & 1) * auVar13._0_4_;
          auVar15._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar13._8_4_;
          auVar15._12_4_ = (uint)(byte)(uVar12 >> 3) * auVar13._12_4_;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = pDVar8;
          vpscatterqd_avx512vl(auVar13 + auVar6._0_16_ * (undefined1  [16])0x8,uVar12,auVar15);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = pDVar8;
          vpscatterqd_avx512vl(auVar1 + auVar5._0_16_ * (undefined1  [16])0x8,uVar11,auVar14);
          auVar13 = vpgatherqd_avx512vl(*(undefined8 *)((long)__addr + __size + 4));
          auVar16._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar13._4_4_;
          auVar16._0_4_ = (uint)((byte)uVar11 & 1) * auVar13._0_4_;
          auVar16._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar13._8_4_;
          auVar16._12_4_ = (uint)(byte)(uVar11 >> 3) * auVar13._12_4_;
          auVar13 = vpgatherqd_avx512vl(*(undefined8 *)((long)__addr + sVar10 + 4));
          auVar17._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar13._4_4_;
          auVar17._0_4_ = (uint)((byte)uVar12 & 1) * auVar13._0_4_;
          auVar17._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar13._8_4_;
          auVar17._12_4_ = (uint)(byte)(uVar12 >> 3) * auVar13._12_4_;
          auVar4 = vpaddq_avx2(auVar6,auVar6);
          auVar4 = vpor_avx2(auVar4,auVar20);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pDVar8;
          vpscatterqd_avx512vl(auVar2 + auVar4._0_16_ * (undefined1  [16])0x4,uVar12,auVar17);
          auVar4 = vpaddq_avx2(auVar5,auVar5);
          auVar4 = vpor_avx2(auVar4,auVar20);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = pDVar8;
          vpscatterqd_avx512vl(auVar3 + auVar4._0_16_ * (undefined1  [16])0x4,uVar11,auVar16);
          auVar6 = vpaddq_avx2(auVar6,auVar21);
          auVar5 = vpaddq_avx2(auVar5,auVar21);
          uVar9 = uVar9 - 8;
        } while (uVar9 != 0);
      }
      munmap(__addr,local_c0.st_size);
      return pDVar8;
    }
    __s = "[ERROR] MALLOC FAILED!";
  }
  puts(__s);
  exit(-1);
}

Assistant:

Data<DATA_LEN>* read_standard_pair_data(const char* PATH, int interval, int* cnt) {
	struct stat buf;
	// printf("Opening file...\n");
	int fd = open(PATH, O_RDONLY);
	fstat(fd, &buf);

	*cnt = buf.st_size / interval;
	uint8_t* raw_addr = (uint8_t*)mmap(NULL, buf.st_size, PROT_READ, MAP_PRIVATE, fd, 0);
	close(fd);
	if (raw_addr == MAP_FAILED) {
		printf("[ERROR] MMAP FAILED!\n");
		exit(-1);
	}

	int num = *cnt;
	void* raw_data = malloc(DATA_LEN * num * 2);
	if (raw_data == NULL) {
		printf("[ERROR] MALLOC FAILED!\n");
		exit(-1);
	}

	Data<DATA_LEN>* data = reinterpret_cast<Data<DATA_LEN>*>(raw_data);
	for (int i = 0; i < num; i++) {
		data[2 * i] = *reinterpret_cast<Data<DATA_LEN>*>(raw_addr + interval * i);
		data[2 * i + 1] =
			*reinterpret_cast<Data<DATA_LEN>*>(raw_addr + interval * i + DATA_LEN);
	}
	munmap(raw_addr, buf.st_size);
	return data;
}